

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastHugeDecimalToNumeric<duckdb::hugeint_t>
          (duckdb *this,hugeint_t input,hugeint_t *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  ulong uVar2;
  hugeint_t hVar3;
  hugeint_t local_78;
  hugeint_t power;
  hugeint_t input_local;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t rounding;
  
  input_local.upper = input.lower;
  uVar2 = (ulong)(uint)((int)parameters << 4);
  power.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar2);
  power.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar2 + 8);
  input_local.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_38,0);
  bVar1 = hugeint_t::operator<(&input_local,&local_38);
  if (bVar1) {
    local_78 = hugeint_t::operator-(&power);
  }
  else {
    local_78.upper = power.upper;
    local_78.lower = power.lower;
  }
  hugeint_t::hugeint_t(&local_48,2);
  rounding = hugeint_t::operator/(&local_78,&local_48);
  local_78 = hugeint_t::operator+(&input_local,&rounding);
  hVar3 = hugeint_t::operator/(&local_78,&power);
  *(hugeint_t *)input.upper = hVar3;
  return true;
}

Assistant:

bool TryCastHugeDecimalToNumeric(hugeint_t input, DST &result, CastParameters &parameters, uint8_t scale) {
	const auto power = Hugeint::POWERS_OF_TEN[scale];
	const auto rounding = ((input < 0) ? -power : power) / 2;
	auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<hugeint_t, DST>(scaled_value, result)) {
		string error = StringUtil::Format("Failed to cast decimal value %s to type %s",
		                                  ConvertToString::Operation(scaled_value), GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}